

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O1

bool __thiscall draco::ObjDecoder::ParseFace(ObjDecoder *this,Status *status)

{
  long lVar1;
  DecoderBuffer *buffer;
  int64_t *piVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  undefined1 uVar6;
  PointIndex vert_id;
  array<int,_3UL> *out_indices;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int c;
  int iVar10;
  bool bVar11;
  bool is_end;
  array<int,_3UL> indices [8];
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  long *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  undefined1 local_98 [8];
  long *local_90;
  long local_80 [10];
  
  buffer = &this->buffer_;
  lVar4 = (this->buffer_).pos_;
  lVar1 = lVar4 + 1;
  if ((this->buffer_).data_size_ < lVar1) {
    return false;
  }
  if (buffer->data_[lVar4] != 'f') {
    return false;
  }
  (this->buffer_).pos_ = lVar1;
  if (this->counting_mode_ == false) {
    out_indices = (array<int,_3UL> *)local_98;
    uVar9 = 0;
    do {
      bVar5 = ParseVertexIndices(this,out_indices);
      if (!bVar5) {
        if (uVar9 < 3) {
          local_e0 = local_d0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e0,"Failed to parse vertex indices","");
          local_c0 = (long *)CONCAT44(local_c0._4_4_,0xffffffff);
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,local_e0,local_d8 + (long)local_e0);
          status->code_ = (Code)local_c0;
          std::__cxx11::string::_M_assign((string *)&status->error_msg_);
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
          if (local_e0 != local_d0) {
            operator_delete(local_e0,local_d0[0] + 1);
          }
          bVar5 = false;
        }
        else {
          bVar5 = true;
        }
        goto LAB_00114fbc;
      }
      uVar9 = uVar9 + 1;
      out_indices = out_indices + 1;
    } while (uVar9 != 8);
    bVar5 = true;
    uVar9 = 8;
LAB_00114fbc:
    if (!bVar5) {
      return true;
    }
    if (2 < (int)uVar9) {
      iVar8 = (int)uVar9 + -3;
      iVar7 = 0;
      do {
        iVar10 = 0;
        do {
          vert_id.value_ = this->num_obj_faces_ * 3 + iVar10;
          uVar3 = iVar7 + iVar10;
          if (iVar10 == 0) {
            uVar3 = 0;
          }
          MapPointToVertexIndices(this,vert_id,(array<int,_3UL> *)(local_98 + (ulong)uVar3 * 0xc));
          if (-1 < (long)this->added_edge_att_id_) {
            *(uint *)(*(long *)((long)(this->out_point_cloud_->attributes_).
                                      super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [this->added_edge_att_id_]._M_t.
                                      super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                                      ._M_t + 0x48) + (ulong)vert_id.value_ * 4) =
                 (uint)(iVar10 == 1 && iVar8 != iVar7);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != 3);
        this->num_obj_faces_ = this->num_obj_faces_ + 1;
        bVar11 = iVar7 != iVar8;
        iVar7 = iVar7 + 1;
      } while (bVar11);
    }
    if (!bVar5) {
      return true;
    }
  }
  else {
    parser::SkipWhitespace(buffer);
    local_e0 = (long *)((ulong)local_e0 & 0xffffffffffffff00);
    iVar7 = 0;
    while ((lVar1 = (this->buffer_).pos_, lVar1 + 1 <= (this->buffer_).data_size_ &&
           (buffer->data_[lVar1] != '\n'))) {
      bVar5 = parser::PeekWhitespace(buffer,(bool *)&local_e0);
      if (bVar5) {
        piVar2 = &(this->buffer_).pos_;
        *piVar2 = *piVar2 + 1;
      }
      else {
        iVar7 = iVar7 + 1;
        uVar6 = parser::PeekWhitespace(buffer,(bool *)&local_e0);
        while ((!(bool)uVar6 && (((ulong)local_e0 & 1) == 0))) {
          piVar2 = &(this->buffer_).pos_;
          *piVar2 = *piVar2 + 1;
          uVar6 = parser::PeekWhitespace(buffer,(bool *)&local_e0);
        }
      }
    }
    if (3 < iVar7) {
      this->has_polygons_ = true;
    }
    if (iVar7 - 3U < 6) {
      this->num_obj_faces_ = this->num_obj_faces_ + iVar7 + -2;
    }
    else {
      local_c0 = &local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Invalid number of indices on a face","");
      local_98._0_4_ = DRACO_ERROR;
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_c0,(long)local_b8 + (long)local_c0);
      status->code_ = local_98._0_4_;
      std::__cxx11::string::_M_assign((string *)&status->error_msg_);
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
    }
    if (5 < iVar7 - 3U) {
      return false;
    }
  }
  parser::SkipLine(buffer);
  return true;
}

Assistant:

bool ObjDecoder::ParseFace(Status *status) {
  constexpr int kMaxCorners = 8;
  char c;
  if (!buffer()->Peek(&c)) {
    return false;
  }
  if (c != 'f') {
    return false;
  }
  // Face definition found!
  buffer()->Advance(1);
  if (!counting_mode_) {
    std::array<int32_t, 3> indices[kMaxCorners];
    // Parse face indices.
    int num_valid_indices = 0;
    for (int i = 0; i < kMaxCorners; ++i) {
      if (!ParseVertexIndices(&indices[i])) {
        if (i >= 3) {
          break;  // It's OK if there is no fourth or higher vertex index.
        }
        *status = Status(Status::DRACO_ERROR, "Failed to parse vertex indices");
        return true;
      }
      ++num_valid_indices;
    }
    // Split quads and other n-gons into n - 2 triangles.
    const int nt = num_valid_indices - 2;
    // Iterate over triangles.
    for (int t = 0; t < nt; t++) {
      // Iterate over corners.
      for (int c = 0; c < 3; c++) {
        const PointIndex vert_id(3 * num_obj_faces_ + c);
        const int triangulated_index = Triangulate(t, c);
        MapPointToVertexIndices(vert_id, indices[triangulated_index]);
        // Save info about new edges that will allow us to reconstruct polygons.
        if (added_edge_att_id_ >= 0) {
          const AttributeValueIndex avi(IsNewEdge(nt, t, c));
          out_point_cloud_->attribute(added_edge_att_id_)
              ->SetPointMapEntry(vert_id, avi);
        }
      }
      ++num_obj_faces_;
    }
  } else {
    // We are in the counting mode.
    // We need to determine how many triangles are in the obj face.
    // Go over the line and check how many gaps there are between non-empty
    // sub-strings.
    parser::SkipWhitespace(buffer());
    int num_indices = 0;
    bool is_end = false;
    while (buffer()->Peek(&c) && c != '\n') {
      if (parser::PeekWhitespace(buffer(), &is_end)) {
        buffer()->Advance(1);
      } else {
        // Non-whitespace reached.. assume it's index declaration, skip it.
        num_indices++;
        while (!parser::PeekWhitespace(buffer(), &is_end) && !is_end) {
          buffer()->Advance(1);
        }
      }
    }
    if (num_indices > 3) {
      has_polygons_ = true;
    }
    if (num_indices < 3 || num_indices > kMaxCorners) {
      *status = ErrorStatus("Invalid number of indices on a face");
      return false;
    }
    // Either one or more new triangles.
    num_obj_faces_ += num_indices - 2;
  }
  parser::SkipLine(buffer());
  return true;
}